

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdSurfOffsetZcull::~MthdSurfOffsetZcull(MthdSurfOffsetZcull *this)

{
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xffffffc0;
			val ^= 1 << (rnd() & 0x1f);
		}
		if (!(rnd() & 3)) {
			val = (rnd() & 1) << (rnd() & 0x1f);
		}
		adjust_orig_icmd(&orig);
	}